

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O1

int __thiscall Cleaner::CleanTarget(Cleaner *this,Node *target)

{
  if (target != (Node *)0x0) {
    this->status_ = 0;
    this->cleaned_files_count_ = 0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(this->removed_)._M_t);
    std::
    _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>::
    clear(&(this->cleaned_)._M_t);
    PrintHeader(this);
    LoadDyndeps(this);
    DoCleanTarget(this,target);
    if (this->config_->verbosity != QUIET) {
      printf("%d files.\n",(ulong)(uint)this->cleaned_files_count_);
    }
    return this->status_;
  }
  __assert_fail("target",
                "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean.cc",
                0xab,"int Cleaner::CleanTarget(Node *)");
}

Assistant:

int Cleaner::CleanTarget(Node* target) {
  assert(target);

  Reset();
  PrintHeader();
  LoadDyndeps();
  DoCleanTarget(target);
  PrintFooter();
  return status_;
}